

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar1;
  byte *pbVar2;
  curl_off_t *pcVar3;
  byte bVar4;
  curl_usessl cVar5;
  void *pvVar6;
  _Bool _Var7;
  CURLcode CVar8;
  imapstate iVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  curl_socket_t sockfd;
  char *pcVar15;
  SessionHandle *pSVar16;
  char *pcVar17;
  CURLcode result;
  bool bVar18;
  char *initresp;
  int imapcode;
  size_t nread;
  char *mech;
  size_t len;
  imapstate state1;
  char *local_90;
  int local_84;
  size_t local_80;
  char *local_78 [4];
  char *local_58;
  SessionHandle *local_50;
  imapstate local_44;
  size_t local_40;
  ulong local_38;
  
  sockfd = conn->sock[0];
  local_80 = 0;
  CVar8 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar8 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar8;
    }
    while (CVar8 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&local_84,&local_80), CVar8 == CURLE_OK) {
      if (local_84 == -1) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (local_84 == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        if (local_84 == 0x4f) {
          (conn->proto).imapc.authmechs = 0;
          (conn->proto).ftpc.diralloc = 0;
          (conn->proto).ftpc.ctl_valid = false;
          CVar8 = imap_sendf(conn,"CAPABILITY");
          if (CVar8 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_CAPABILITY;
          }
        }
        else {
          Curl_failf(conn->data,"Got unexpected imap-server response");
          CVar8 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        break;
      case IMAP_CAPABILITY:
        pSVar16 = conn->data;
        if (local_84 == 0x4f) {
          cVar5 = (pSVar16->set).use_ssl;
          if ((cVar5 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).ftpc.ctl_valid == true) {
              CVar8 = imap_sendf(conn,"STARTTLS");
              if (CVar8 == CURLE_OK) {
                (conn->proto).imapc.state = IMAP_STARTTLS;
              }
              break;
            }
            if (cVar5 != CURLUSESSL_TRY) {
              Curl_failf(pSVar16,"STARTTLS not supported.");
              goto LAB_0056dbdf;
            }
          }
        }
        else if (local_84 == 0x2a) {
          pcVar17 = (pSVar16->state).buffer + 2;
          do {
            while (uVar13 = (ulong)(byte)*pcVar17, 0x20 < uVar13) {
LAB_0056dcf2:
              uVar13 = 0;
              while ((0x20 < (ulong)(byte)pcVar17[uVar13] ||
                     ((0x100002601U >> ((ulong)(byte)pcVar17[uVar13] & 0x3f) & 1) == 0))) {
                uVar13 = uVar13 + 1;
              }
              pcVar15 = pcVar17;
              if (uVar13 == 7) {
                if (*(int *)(pcVar17 + 3) != 0x52492d4c || *(int *)pcVar17 != 0x4c534153)
                goto LAB_0056dd7d;
                (conn->proto).ftpc.cwdfail = true;
                uVar12 = 7;
              }
              else if (uVar13 == 0xd) {
                if (*(long *)(pcVar17 + 5) == 0x44454c4241534944 &&
                    *(long *)pcVar17 == 0x5349444e49474f4c) {
                  (conn->proto).ftpc.cwddone = true;
                  uVar12 = 0xd;
                  goto LAB_0056df0e;
                }
LAB_0056dd7d:
                uVar12 = uVar13;
                if ((5 < uVar13) && (pcVar17[4] == 0x3d && *(int *)pcVar17 == 0x48545541)) {
                  pcVar15 = pcVar17 + 5;
                  if (uVar13 == 10) {
                    if (pcVar17[9] == 0x4e && *(int *)pcVar15 == 0x49474f4c) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 1;
                    }
                    else {
                      if (pcVar17[9] != 0x4e || *(int *)pcVar15 != 0x49414c50) goto LAB_0056ddd5;
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 2;
                    }
                    uVar12 = 5;
                  }
                  else {
LAB_0056ddd5:
                    if ((uVar13 == 0xd) && (*(long *)pcVar15 == 0x35444d2d4d415243)) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 4;
                      pcVar17 = pcVar15;
                      goto LAB_0056deda;
                    }
                    if (uVar13 == 0xb) {
                      if (*(short *)(pcVar17 + 9) != 0x4950 || *(int *)pcVar15 != 0x41535347)
                      goto LAB_0056de5d;
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x10;
                      uVar12 = 6;
                    }
                    else if ((uVar13 == 0xf) &&
                            (*(short *)(pcVar17 + 0xd) == 0x3544 &&
                             *(long *)pcVar15 == 0x4d2d545345474944)) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 8;
                      uVar12 = 10;
                    }
                    else {
LAB_0056de5d:
                      if ((uVar13 == 0xd) && (*(long *)pcVar15 == 0x4c414e5245545845)) {
                        pbVar2 = (byte *)((long)&conn->proto + 0x78);
                        *pbVar2 = *pbVar2 | 0x20;
                        pcVar17 = pcVar15;
                        goto LAB_0056deda;
                      }
                      uVar12 = uVar13 - 5;
                      if ((uVar13 == 9) && (*(int *)pcVar15 == 0x4d4c544e)) {
                        pbVar2 = (byte *)((long)&conn->proto + 0x78);
                        *pbVar2 = *pbVar2 | 0x40;
                        uVar12 = 4;
                      }
                      else if ((uVar13 == 0xc) &&
                              (uVar12 = 7,
                              *(int *)(pcVar17 + 8) == 0x32485455 && *(int *)pcVar15 == 0x55414f58))
                      {
                        pbVar2 = (byte *)((long)&conn->proto + 0x78);
                        *pbVar2 = *pbVar2 | 0x80;
                      }
                    }
                  }
                }
              }
              else {
                if ((uVar13 != 8) || (*(long *)pcVar17 != 0x534c545452415453)) goto LAB_0056dd7d;
                (conn->proto).ftpc.ctl_valid = true;
LAB_0056deda:
                uVar12 = 8;
                pcVar15 = pcVar17;
              }
LAB_0056df0e:
              pcVar17 = pcVar15 + uVar12;
            }
            if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
              if (uVar13 != 0) goto LAB_0056dcf2;
              goto LAB_0056e28d;
            }
            pcVar17 = pcVar17 + 1;
          } while( true );
        }
LAB_0056e35c:
        CVar8 = imap_perform_authentication(conn);
        break;
      case IMAP_STARTTLS:
        CVar8 = CURLE_NOT_BUILT_IN;
        if (local_84 != 0x4f) {
          if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_0056e35c;
          Curl_failf(conn->data,"STARTTLS denied. %c");
LAB_0056dbdf:
          CVar8 = CURLE_USE_SSL_FAILED;
        }
        break;
      default:
        goto switchD_0056da38_caseD_4;
      case IMAP_AUTHENTICATE_PLAIN:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 == 0x2b) {
          CVar8 = Curl_sasl_create_plain_message
                            (pSVar16,conn->user,conn->passwd,&local_90,(size_t *)local_78);
          goto LAB_0056e1d9;
        }
        pcVar17 = "Access denied. %c";
LAB_0056e2ef:
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        Curl_failf(pSVar16,pcVar17);
        CVar8 = CURLE_LOGIN_DENIED;
        goto LAB_0056e2fc;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != 0x2b) {
LAB_0056e218:
          pcVar17 = "Access denied: %d";
          goto LAB_0056e2ef;
        }
        CVar8 = Curl_sasl_create_login_message(pSVar16,conn->user,&local_90,(size_t *)local_78);
        if ((local_90 == (char *)0x0 || CVar8 != CURLE_OK) ||
           (CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar8 != CURLE_OK)) goto LAB_0056e2fc;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
        goto LAB_0056e4e1;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != 0x2b) goto LAB_0056e218;
        CVar8 = Curl_sasl_create_login_message(pSVar16,conn->passwd,&local_90,(size_t *)local_78);
        goto LAB_0056e1d9;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        local_40 = 0;
        if (local_84 == 0x2b) {
          imap_get_message((pSVar16->state).buffer,&local_90);
          CVar8 = Curl_sasl_decode_cram_md5_message(local_90,local_78,&local_40);
          if (CVar8 == CURLE_OK) {
            CVar8 = Curl_sasl_create_cram_md5_message
                              (pSVar16,local_78[0],conn->user,conn->passwd,&local_58,&local_40);
            if ((local_58 != (char *)0x0 && CVar8 == CURLE_OK) &&
               (CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar8 == CURLE_OK)) {
              iVar9 = IMAP_AUTHENTICATE_FINAL;
              goto LAB_0056e6af;
            }
          }
          else {
            CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
            if (CVar8 == CURLE_OK) {
              iVar9 = IMAP_AUTHENTICATE_CANCEL;
LAB_0056e6af:
              (conn->proto).imapc.state = iVar9;
              CVar8 = CURLE_OK;
            }
          }
          if (local_78[0] != (char *)0x0) {
            (*Curl_cfree)(local_78[0]);
            local_78[0] = (char *)0x0;
          }
          if (local_58 != (char *)0x0) {
            (*Curl_cfree)(local_58);
            local_58 = (char *)0x0;
          }
        }
        else {
LAB_0056e06b:
          local_58 = (char *)0x0;
          local_78[0] = (char *)0x0;
          local_90 = (char *)0x0;
          Curl_failf(pSVar16,"Access denied: %d");
LAB_0056e510:
          CVar8 = CURLE_LOGIN_DENIED;
        }
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        if (local_84 != 0x2b) goto LAB_0056e06b;
        imap_get_message((pSVar16->state).buffer,local_78);
        CVar8 = Curl_sasl_create_digest_md5_message
                          (pSVar16,local_78[0],conn->user,conn->passwd,"imap",&local_90,
                           (size_t *)&local_58);
        if (CVar8 == CURLE_OK) {
          CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_90);
          if (CVar8 == CURLE_OK) {
            iVar9 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
            goto LAB_0056e4db;
          }
        }
        else if ((CVar8 == CURLE_BAD_CONTENT_ENCODING) &&
                (CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*"), CVar8 == CURLE_OK)) {
          iVar9 = IMAP_AUTHENTICATE_CANCEL;
LAB_0056e4db:
          (conn->proto).imapc.state = iVar9;
          goto LAB_0056e4e1;
        }
        goto LAB_0056e2fc;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        if (local_84 != 0x2b) {
LAB_0056e258:
          pSVar16 = conn->data;
          pcVar17 = "Authentication failed: %d";
LAB_0056e262:
          Curl_failf(pSVar16,pcVar17);
          CVar8 = CURLE_LOGIN_DENIED;
          break;
        }
        CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
        if (CVar8 != CURLE_OK) break;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
        goto LAB_0056e28d;
      case IMAP_AUTHENTICATE_XOAUTH2:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        if (local_84 != 0x2b) goto LAB_0056e218;
        CVar8 = Curl_sasl_create_xoauth2_message
                          (pSVar16,conn->user,conn->xoauth2_bearer,&local_90,(size_t *)local_78);
LAB_0056e1d9:
        if ((local_90 != (char *)0x0 && CVar8 == CURLE_OK) &&
           (CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar8 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_0056e4e1:
          CVar8 = CURLE_OK;
        }
LAB_0056e2fc:
        if (local_90 != (char *)0x0) {
          (*Curl_cfree)(local_90);
          local_90 = (char *)0x0;
        }
        break;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar16 = conn->data;
        local_78[0] = (char *)0x0;
        local_90 = (char *)0x0;
        local_58 = (char *)0x0;
        local_40 = local_40 & 0xffffffff00000000;
        local_44 = IMAP_STOP;
        puVar1 = &(conn->proto).imapc.authmechs;
        *puVar1 = *puVar1 ^ (conn->proto).imapc.authused;
        CVar8 = imap_calc_sasl_details
                          (conn,local_78,&local_90,(size_t *)&local_58,(imapstate *)&local_40,
                           &local_44);
        if (CVar8 == CURLE_OK) {
          if (local_78[0] == (char *)0x0) {
            if (((conn->proto).ftpc.cwddone != false) ||
               ((*(byte *)((long)&conn->proto + 0x7c) & 1) == 0)) {
              pcVar17 = "Authentication cancelled";
              goto LAB_0056e509;
            }
            CVar8 = imap_perform_login(conn);
          }
          else {
            CVar8 = imap_perform_authenticate
                              (conn,local_78[0],local_90,(imapstate)local_40,local_44);
            if (local_90 != (char *)0x0) {
              (*Curl_cfree)(local_90);
              local_90 = (char *)0x0;
            }
          }
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
        if (local_84 != 0x4f) goto LAB_0056e258;
        goto switchD_0056da38_caseD_4;
      case IMAP_LOGIN:
        if (local_84 != 0x4f) {
          pSVar16 = conn->data;
          pcVar17 = "Access denied. %c";
          goto LAB_0056e262;
        }
switchD_0056da38_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
LAB_0056e28d:
        CVar8 = CURLE_OK;
        break;
      case IMAP_LIST:
      case IMAP_SEARCH:
        if (local_84 == 0x4f) goto switchD_0056da38_caseD_4;
        CVar8 = CURLE_QUOTE_ERROR;
        if (local_84 == 0x2a) {
          local_50 = (SessionHandle *)CONCAT44(local_50._4_4_,sockfd);
          pSVar16 = conn->data;
          pcVar17 = (pSVar16->state).buffer;
          sVar11 = strlen(pcVar17);
          (pSVar16->state).buffer[sVar11] = '\n';
          CVar8 = Curl_client_write(conn,1,pcVar17,sVar11 + 1);
          (pSVar16->state).buffer[sVar11] = '\0';
          sockfd = (curl_socket_t)local_50;
        }
        break;
      case IMAP_SELECT:
        pSVar16 = conn->data;
        if (local_84 == 0x4f) {
          pvVar6 = (pSVar16->req).protop;
          if (((*(char **)((long)pvVar6 + 0x10) == (char *)0x0) ||
              (pcVar17 = (conn->proto).imapc.mailbox_uidvalidity, pcVar17 == (char *)0x0)) ||
             (iVar10 = strcmp(*(char **)((long)pvVar6 + 0x10),pcVar17), iVar10 == 0)) {
            pcVar17 = (*Curl_cstrdup)(*(char **)((long)pvVar6 + 8));
            (conn->proto).ftpc.prevpath = pcVar17;
            if (*(long *)((long)pvVar6 + 0x38) == 0) {
              if (*(long *)((long)pvVar6 + 0x30) == 0) {
                CVar8 = imap_perform_fetch(conn);
              }
              else {
                CVar8 = imap_perform_search(conn);
              }
            }
            else {
              CVar8 = imap_perform_list(conn);
            }
          }
          else {
            Curl_failf(pSVar16,"Mailbox UIDVALIDITY has changed");
            CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
          }
        }
        else {
          if (local_84 != 0x2a) {
            pcVar17 = "Select failed";
LAB_0056e509:
            Curl_failf(pSVar16,pcVar17);
            goto LAB_0056e510;
          }
          CVar8 = CURLE_OK;
          iVar10 = __isoc99_sscanf((pSVar16->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   local_78);
          if (iVar10 == 1) {
            pcVar17 = (conn->proto).imapc.mailbox_uidvalidity;
            if (pcVar17 != (char *)0x0) {
              (*Curl_cfree)(pcVar17);
              (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            }
            pcVar17 = (*Curl_cstrdup)((char *)local_78);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar17;
            CVar8 = CURLE_OK;
          }
        }
        break;
      case IMAP_FETCH:
        pSVar16 = conn->data;
        if (local_84 == 0x2a) {
          pcVar17 = (pSVar16->state).buffer;
          pcVar15 = (pSVar16->state).buffer;
          while( true ) {
            pcVar15 = pcVar15 + 1;
            bVar4 = pcVar15[-1];
            uVar13 = (ulong)bVar4;
            if (bVar4 == 0) break;
            if (bVar4 == 0x7b) {
              uVar13 = strtol(pcVar15,local_78,10);
              if (1 < (long)local_78[0] - (long)pcVar17) {
                if ((*local_78[0] == '}') && (local_78[0][1] == '\r')) {
                  bVar18 = local_78[0][2] == '\0';
                }
                else {
                  bVar18 = false;
                }
                goto LAB_0056e586;
              }
              break;
            }
            pcVar17 = pcVar17 + 1;
          }
          bVar18 = false;
LAB_0056e586:
          if (bVar18) {
            CVar8 = CURLE_OK;
            Curl_infof(pSVar16,"Found %lu bytes to download\n",uVar13);
            local_50 = pSVar16;
            Curl_pgrsSetDownloadSize(pSVar16,uVar13);
            pcVar17 = (pp->ftpc).pp.cache;
            if (pcVar17 != (char *)0x0) {
              uVar12 = (conn->proto).ftpc.pp.cache_size;
              if (uVar13 <= uVar12) {
                uVar12 = uVar13;
              }
              CVar8 = Curl_client_write(conn,1,pcVar17,uVar12);
              if (CVar8 != CURLE_OK) break;
              pcVar3 = &(local_50->req).bytecount;
              *pcVar3 = *pcVar3 + uVar12;
              local_38 = uVar13;
              Curl_infof(local_50,"Written %lu bytes, %lu bytes are left for transfer\n",uVar12);
              pvVar6 = (conn->proto).generic;
              uVar13 = (conn->proto).ftpc.pp.cache_size;
              sVar11 = uVar13 - uVar12;
              if (uVar13 < uVar12 || sVar11 == 0) {
                if (pvVar6 != (void *)0x0) {
                  (*Curl_cfree)(pvVar6);
                  (pp->ftpc).pp.cache = (char *)0x0;
                }
                sVar14 = 0;
              }
              else {
                memmove(pvVar6,(void *)((long)pvVar6 + uVar12),sVar11);
                sVar14 = (conn->proto).ftpc.pp.cache_size - uVar12;
              }
              (conn->proto).ftpc.pp.cache_size = sVar14;
              uVar13 = local_38;
            }
            if ((local_50->req).bytecount == uVar13) {
              iVar10 = -1;
              uVar13 = 0xffffffffffffffff;
            }
            else {
              (local_50->req).maxdownload = uVar13;
              iVar10 = 0;
            }
            Curl_setup_transfer(conn,iVar10,uVar13,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          }
          else {
            Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
            CVar8 = CURLE_FTP_WEIRD_SERVER_REPLY;
          }
          (conn->proto).imapc.state = IMAP_STOP;
        }
        else {
          Curl_pgrsSetDownloadSize(pSVar16,-1);
          (conn->proto).imapc.state = IMAP_STOP;
          CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
        break;
      case IMAP_FETCH_FINAL:
        CVar8 = CURLE_FTP_WEIRD_SERVER_REPLY;
        goto LAB_0056e27a;
      case IMAP_APPEND:
        CVar8 = CURLE_UPLOAD_FAILED;
        if (local_84 == 0x2b) {
          Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
          Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
          (conn->proto).imapc.state = IMAP_STOP;
          CVar8 = CURLE_OK;
        }
        break;
      case IMAP_APPEND_FINAL:
        CVar8 = CURLE_UPLOAD_FAILED;
LAB_0056e27a:
        if (local_84 == 0x4f) goto switchD_0056da38_caseD_4;
      }
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
      _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
      if (!_Var7) {
        return CURLE_OK;
      }
    }
  }
  return CVar8;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_PLAIN:
      result = imap_state_auth_plain_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN:
      result = imap_state_auth_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      result = imap_state_auth_login_password_resp(conn, imapcode,
                                                   imapc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case IMAP_AUTHENTICATE_CRAMMD5:
      result = imap_state_auth_cram_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5:
      result = imap_state_auth_digest_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      result = imap_state_auth_digest_resp_resp(conn, imapcode, imapc->state);
      break;
#endif

#ifdef USE_NTLM
    case IMAP_AUTHENTICATE_NTLM:
      result = imap_state_auth_ntlm_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_NTLM_TYPE2MSG:
      result = imap_state_auth_ntlm_type2msg_resp(conn, imapcode,
                                                  imapc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case IMAP_AUTHENTICATE_GSSAPI:
      result = imap_state_auth_gssapi_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_TOKEN:
      result = imap_state_auth_gssapi_token_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_NO_DATA:
      result = imap_state_auth_gssapi_no_data_resp(conn, imapcode,
                                                   imapc->state);
      break;
#endif

    case IMAP_AUTHENTICATE_XOAUTH2:
      result = imap_state_auth_xoauth2_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_CANCEL:
      result = imap_state_auth_cancel_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_FINAL:
      result = imap_state_auth_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_list_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_search_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}